

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O2

bool __thiscall
QNativeSocketEngine::setMulticastInterface(QNativeSocketEngine *this,QNetworkInterface *iface)

{
  QNativeSocketEnginePrivate *this_00;
  char cVar1;
  bool bVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QNativeSocketEnginePrivate **)(this + 8);
  cVar1 = (**(code **)(*(long *)this + 0x78))();
  if (cVar1 == '\0') {
    pcVar3 = 
    "QNativeSocketEngine::setMulticastInterface() was called on an uninitialized socket device";
  }
  else {
    if ((this_00->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
        bVar2 = QNativeSocketEnginePrivate::nativeSetMulticastInterface(this_00,iface);
        return bVar2;
      }
      goto LAB_001b8d3b;
    }
    pcVar3 = 
    "QNativeSocketEngine::setMulticastInterface() was called by a socket other than QAbstractSocket::UdpSocket"
    ;
  }
  local_20 = "default";
  local_38[0x14] = '\0';
  local_38[0x15] = '\0';
  local_38[0x16] = '\0';
  local_38[0x17] = '\0';
  local_38[0xc] = '\0';
  local_38[0xd] = '\0';
  local_38[0xe] = '\0';
  local_38[0xf] = '\0';
  local_38[0x10] = '\0';
  local_38[0x11] = '\0';
  local_38[0x12] = '\0';
  local_38[0x13] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '\0';
  local_38[8] = '\0';
  local_38[9] = '\0';
  local_38[10] = '\0';
  local_38[0xb] = '\0';
  local_38[0] = '\x02';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  QMessageLogger::warning(local_38,pcVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
LAB_001b8d3b:
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEngine::setMulticastInterface(const QNetworkInterface &iface)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::setMulticastInterface(), false);
    Q_CHECK_TYPE(QNativeSocketEngine::setMulticastInterface(), QAbstractSocket::UdpSocket, false);
    return d->nativeSetMulticastInterface(iface);
}